

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::fuse_deconvolution_batchnorm(NetOptimize *this)

{
  float fVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  pointer ppLVar4;
  Layer *pLVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  pointer piVar11;
  long lVar12;
  ulong uVar13;
  size_type __n;
  ulong uVar14;
  ulong uVar15;
  size_type sVar16;
  float fVar17;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  Mat local_a8;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar12 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar12 != 0) {
    uVar13 = lVar12 >> 3;
    lVar12 = 0;
    do {
      iVar7 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar12]->type);
      if (iVar7 == 0) {
        uVar15 = lVar12 + 1;
        if (uVar15 < uVar13) {
          iVar7 = *((((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar12]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar8 = std::__cxx11::string::compare
                              ((char *)&(((this->super_ModelWriter).layers)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar15]->type);
            if (((iVar8 == 0) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar15],
                piVar10 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar10 == 4)) &&
               (*piVar10 == iVar7)) goto LAB_00145b78;
            uVar15 = uVar15 + 1;
          } while (uVar15 < uVar13);
        }
        else {
LAB_00145b78:
          if (uVar15 != uVar13) {
            ppLVar4 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar3 = ppLVar4[lVar12];
            pLVar5 = ppLVar4[uVar15];
            fprintf(_stderr,"fuse_deconvolution_batchnorm %s %s\n",(pLVar3->name)._M_dataplus._M_p,
                    (pLVar5->name)._M_dataplus._M_p);
            iVar7 = *(int *)&pLVar5[1]._vptr_Layer;
            __n = (size_type)iVar7;
            fVar1 = *(float *)((long)&pLVar5[1]._vptr_Layer + 4);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_48,__n,(allocator_type *)&local_a8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_60,__n,(allocator_type *)&local_a8);
            if (0 < iVar7) {
              sVar16 = 0;
              do {
                fVar17 = (float)pLVar5[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage[sVar16] + fVar1;
                if (fVar17 < 0.0) {
                  fVar17 = sqrtf(fVar17);
                }
                else {
                  fVar17 = SQRT(fVar17);
                }
                lVar6 = *(long *)&pLVar5[1].one_blob_only;
                local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[sVar16] =
                     *(float *)(*(long *)&pLVar5[2].support_tensor_storage + sVar16 * 4) -
                     (*(float *)(lVar6 + sVar16 * 4) *
                     *(float *)(pLVar5[1].name._M_dataplus._M_p + sVar16 * 4)) / fVar17;
                local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[sVar16] = *(float *)(lVar6 + sVar16 * 4) / fVar17;
                sVar16 = sVar16 + 1;
              } while (__n != sVar16);
            }
            if (*(int *)((long)&pLVar3[1].type._M_string_length + 4) == 0) {
              *(undefined4 *)((long)&pLVar3[1].type._M_string_length + 4) = 1;
              local_a8.cstep = 0;
              local_a8.data = (void *)0x0;
              local_a8.refcount._0_4_ = 0;
              local_a8.refcount._4_4_ = 0;
              local_a8.elemsize._0_4_ = 0;
              local_a8.elemsize._4_4_ = 0;
              local_a8.elempack = 0;
              local_a8.h = 0;
              local_a8.d = 0;
              local_a8.c = 0;
              local_a8.allocator = (Allocator *)0x0;
              local_a8.dims = 0;
              local_a8.w = 0;
              ncnn::Mat::create(&local_a8,iVar7,4,(Allocator *)0x0);
              piVar10 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
              if ((Mat *)&pLVar3[2].one_blob_only != &local_a8) {
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + 1;
                  UNLOCK();
                }
                piVar10 = *(int **)&pLVar3[2].support_tensor_storage;
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + -1;
                  UNLOCK();
                  if (*piVar10 == 0) {
                    if (*(long **)&pLVar3[2].typeindex == (long *)0x0) {
                      if (*(void **)&pLVar3[2].one_blob_only != (void *)0x0) {
                        free(*(void **)&pLVar3[2].one_blob_only);
                      }
                    }
                    else {
                      (**(code **)(**(long **)&pLVar3[2].typeindex + 0x18))();
                    }
                  }
                }
                *(void **)&pLVar3[2].one_blob_only = local_a8.data;
                piVar10 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
                *(int **)&pLVar3[2].support_tensor_storage = piVar10;
                pLVar3[2].support_reserved_6 = (bool)(char)(undefined4)local_a8.elemsize;
                pLVar3[2].support_reserved_7 =
                     (bool)(char)((uint)(undefined4)local_a8.elemsize >> 8);
                pLVar3[2].support_reserved_8 =
                     (bool)(char)((uint)(undefined4)local_a8.elemsize >> 0x10);
                pLVar3[2].support_reserved_9 =
                     (bool)(char)((uint)(undefined4)local_a8.elemsize >> 0x18);
                pLVar3[2].support_reserved_10 = (bool)(char)local_a8.elemsize._4_4_;
                pLVar3[2].support_reserved_11 = (bool)(char)((uint)local_a8.elemsize._4_4_ >> 8);
                pLVar3[2].support_reserved_12 = (bool)(char)((uint)local_a8.elemsize._4_4_ >> 0x10);
                pLVar3[2].support_reserved_13 = (bool)(char)((uint)local_a8.elemsize._4_4_ >> 0x18);
                *(int *)&pLVar3[2].userdata = local_a8.elempack;
                *(Allocator **)&pLVar3[2].typeindex = local_a8.allocator;
                *(int *)&pLVar3[2].type._M_dataplus._M_p = local_a8.dims;
                *(int *)((long)&pLVar3[2].type._M_dataplus._M_p + 4) = local_a8.w;
                *(int *)&pLVar3[2].type._M_string_length = local_a8.h;
                *(int *)((long)&pLVar3[2].type._M_string_length + 4) = local_a8.d;
                *(int *)&pLVar3[2].type.field_2 = local_a8.c;
                *(size_t *)((long)&pLVar3[2].type.field_2 + 8) = local_a8.cstep;
              }
              if (piVar10 != (int *)0x0) {
                LOCK();
                *piVar10 = *piVar10 + -1;
                UNLOCK();
                if (*piVar10 == 0) {
                  if (local_a8.allocator == (Allocator *)0x0) {
                    if (local_a8.data != (void *)0x0) {
                      free(local_a8.data);
                    }
                  }
                  else {
                    (*(local_a8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              uVar9 = *(int *)&pLVar3[2].type.field_2 * *(int *)((long)&pLVar3[2].type.field_2 + 8);
              if (0 < (int)uVar9) {
                memset(*(void **)&pLVar3[2].one_blob_only,0,(ulong)uVar9 << 2);
              }
            }
            if (0 < iVar7) {
              piVar11 = pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              lVar6 = *(long *)&pLVar3[2].one_blob_only;
              uVar15 = (long)*(int *)&pLVar3[1].type.field_2 / (long)iVar7;
              iVar7 = (int)uVar15;
              sVar16 = 0;
              do {
                if (0 < iVar7) {
                  uVar14 = 0;
                  do {
                    piVar11[uVar14] =
                         (int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[sVar16] * (float)piVar11[uVar14]);
                    uVar14 = uVar14 + 1;
                  } while ((uVar15 & 0xffffffff) != uVar14);
                }
                *(float *)(lVar6 + sVar16 * 4) =
                     *(float *)(lVar6 + sVar16 * 4) *
                     local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar16] +
                     local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar16];
                sVar16 = sVar16 + 1;
                piVar11 = piVar11 + iVar7;
              } while (sVar16 != __n);
            }
            if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            iVar7 = *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar7;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar7].producer = (int)lVar12;
            std::__cxx11::string::_M_replace
                      ((ulong)&pLVar5->type,0,(char *)(pLVar5->type)._M_string_length,0x31f19a);
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != uVar13 + (uVar13 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_deconvolution_batchnorm()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Deconvolution")
            continue;

        // Deconvolution - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse Deconvolution - BatchNorm to Deconvolution
        ncnn::Deconvolution* deconvolution = (ncnn::Deconvolution*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_deconvolution_batchnorm %s %s\n", deconvolution->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i = 0; i < channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (deconvolution->bias_term == 0)
            {
                // init bias as zero
                deconvolution->bias_term = 1;
                deconvolution->bias_data = ncnn::Mat(channels);
                deconvolution->bias_data.fill(0.f);
            }

            const int weight_per_outch = deconvolution->weight_data_size / channels;

            float* weight = deconvolution->weight_data;
            float* bias = deconvolution->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        deconvolution->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}